

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::iterate
          (ImageBindingRenderCase *this)

{
  ostringstream *this_00;
  TestType TVar1;
  code *pcVar2;
  bool bVar3;
  bool imageTestPassed;
  int iVar4;
  undefined4 uVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  bool queryTestPassed;
  ulong uVar7;
  uint uVar8;
  GLint val;
  string name;
  int local_1f4;
  long local_1f0;
  uint local_1e4;
  string *local_1e0;
  string local_1d8;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar4 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_1f0 = CONCAT44(extraout_var,iVar4);
  uVar7 = (ulong)(this->super_LayoutBindingRenderCase).m_numBindings;
  TVar1 = (this->super_LayoutBindingRenderCase).m_testType;
  LayoutBindingRenderCase::initRenderState(&this->super_LayoutBindingRenderCase);
  local_1b8 = uVar7;
  if ((long)uVar7 < 1) {
    queryTestPassed = true;
    imageTestPassed = true;
  }
  else {
    uVar8 = TVar1 - TESTTYPE_BINDING_ARRAY;
    local_1e0 = &(this->super_LayoutBindingRenderCase).m_uniformName;
    imageTestPassed = true;
    uVar7 = 0;
    queryTestPassed = true;
    local_1e4 = uVar8;
    do {
      (**(code **)(local_1f0 + 0x14f0))
                ((this->super_LayoutBindingRenderCase).m_shaderProgramArrayNdxLoc,uVar7 & 0xffffffff
                );
      if (uVar8 < 2) {
        getUniformName(&local_1d8,local_1e0,0,(int)uVar7);
      }
      else {
        getUniformName(&local_1d8,local_1e0,(int)uVar7);
      }
      iVar4 = (this->super_LayoutBindingRenderCase).m_bindings.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar7];
      local_1f4 = -1;
      pcVar2 = *(code **)(local_1f0 + 0xb68);
      dVar6 = (((this->super_LayoutBindingRenderCase).m_program)->m_program).m_program;
      uVar5 = (**(code **)(local_1f0 + 0xb48))(dVar6,local_1d8._M_dataplus._M_p);
      (*pcVar2)(dVar6,uVar5,&local_1f4);
      local_1b0._0_8_ =
           ((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Querying binding point for ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": ",2);
      std::ostream::operator<<(this_00,local_1f4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," == ",4);
      std::ostream::operator<<(this_00,iVar4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      dVar6 = (**(code **)(local_1f0 + 0x800))();
      glu::checkError(dVar6,"Binding point query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                      ,0x593);
      if (local_1f4 != iVar4) {
        queryTestPassed = false;
      }
      bVar3 = LayoutBindingRenderCase::drawAndVerifyResult
                        (&this->super_LayoutBindingRenderCase,
                         (this->m_textureColors).
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar7);
      uVar8 = local_1e4;
      if (!bVar3) {
        imageTestPassed = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_1b8);
  }
  LayoutBindingRenderCase::setTestResult
            (&this->super_LayoutBindingRenderCase,queryTestPassed,imageTestPassed);
  return STOP;
}

Assistant:

TestCase::IterateResult ImageBindingRenderCase::iterate	(void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				iterations		= m_numBindings;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	bool					queryTestPassed	= true;
	bool					imageTestPassed = true;

	// Set the viewport and enable the shader program
	initRenderState();

	for (int iterNdx = 0; iterNdx < iterations; ++iterNdx)
	{
		// Set the uniform value indicating the current array index
		gl.uniform1i(m_shaderProgramArrayNdxLoc, iterNdx);

		const std::string	name	= (arrayInstance ? getUniformName(m_uniformName, 0, iterNdx) : getUniformName(m_uniformName, iterNdx));
		const glw::GLint	binding = m_bindings[iterNdx];
		glw::GLint			val		= -1;

		gl.getUniformiv(m_program->getProgram(), gl.getUniformLocation(m_program->getProgram(), name.c_str()), &val);
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying binding point for " << name << ": " << val << " == " << binding << tcu::TestLog::EndMessage;
		GLU_EXPECT_NO_ERROR(gl.getError(), "Binding point query failed");

		// Draw and verify
		if (val != binding)
			queryTestPassed = false;
		if (!drawAndVerifyResult(m_textureColors[iterNdx]))
			imageTestPassed = false;
	}

	setTestResult(queryTestPassed, imageTestPassed);
	return STOP;
}